

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O0

void __thiscall
Clasp::ShortImplicationsGraph::remove_bin(ShortImplicationsGraph *this,ImplicationList *w,Literal p)

{
  undefined4 in_EDX;
  left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_> *in_RSI;
  left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_> *in_RDI;
  Literal *unaff_retaddr;
  undefined4 in_stack_00000020;
  undefined4 in_stack_fffffffffffffff8;
  
  bk_lib::detail::left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>::
  left_begin((left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_> *)0x1d0726)
  ;
  bk_lib::detail::left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>::
  left_end(in_RSI);
  std::find<Clasp::Literal*,Clasp::Literal>
            (unaff_retaddr,(Literal *)CONCAT44(in_EDX,in_stack_fffffffffffffff8),(Literal *)in_RDI);
  bk_lib::detail::left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>::
  erase_left_unordered(in_RDI,(left_iterator)in_RSI);
  bk_lib::left_right_sequence<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>,_56U>::
  try_shrink((left_right_sequence<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>,_56U> *)
             CONCAT44(p.rep_,in_stack_00000020));
  return;
}

Assistant:

void ShortImplicationsGraph::remove_bin(ImplicationList& w, Literal p) {
	w.erase_left_unordered(std::find(w.left_begin(), w.left_end(), p));
	w.try_shrink();
}